

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void units::cleanDotNotation(string *unit_string,uint64_t match_flags)

{
  DotInterpretation DVar1;
  bool bVar2;
  char *pcVar3;
  undefined1 *puVar4;
  ulong uVar5;
  long lVar6;
  char cVar7;
  size_type slashloc;
  size_type nloc_1;
  size_type nloc;
  size_type sStack_30;
  int skipped;
  size_type dloc;
  size_t st;
  DotInterpretation dInt;
  uint64_t match_flags_local;
  string *unit_string_local;
  
  DVar1 = findDotInterpretation(unit_string);
  cVar7 = (char)unit_string;
  sStack_30 = std::__cxx11::string::find_first_of(cVar7,0x2e);
  nloc._4_4_ = 0;
  do {
    if (sStack_30 == 0xffffffffffffffff) {
      if (1 < nloc._4_4_) {
        nloc._4_4_ = 0;
        sStack_30 = std::__cxx11::string::find_first_of(cVar7,0x2e);
        while (sStack_30 != -1) {
          do {
            pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
            if (*pcVar3 == '.') goto LAB_001b2715;
            pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
            bVar2 = isDigitCharacter(*pcVar3);
          } while (bVar2);
          sStack_30 = std::__cxx11::string::find_first_of(cVar7,0x2e);
LAB_001b2715:
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
          if (*pcVar3 == '.') {
            puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)unit_string);
            *puVar4 = 0x2a;
            sStack_30 = std::__cxx11::string::find_first_of(cVar7,0x2e);
          }
          else {
            nloc._4_4_ = nloc._4_4_ + 1;
          }
        }
      }
      if (0 < nloc._4_4_) {
        sStack_30 = std::__cxx11::string::find_first_of(cVar7,0x2e);
        while (sStack_30 != 0xffffffffffffffff) {
          do {
            slashloc = sStack_30 - 1;
            if (slashloc == 0) goto LAB_001b2808;
            pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
            bVar2 = isDigitCharacter(*pcVar3);
            sStack_30 = slashloc;
          } while (bVar2);
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
          if ((*pcVar3 == 'e') ||
             (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)unit_string), *pcVar3 == 'E')
             ) {
            puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)unit_string);
            *puVar4 = 0x2a;
          }
LAB_001b2808:
          sStack_30 = std::__cxx11::string::find_first_of(cVar7,0x2e);
        }
      }
      if (((match_flags & 0x400) != 0) &&
         (lVar6 = std::__cxx11::string::find_last_of(cVar7,0x2f), lVar6 != -1)) {
        std::__cxx11::string::insert((ulong)unit_string,lVar6 + 1,'\x01');
        std::__cxx11::string::push_back(cVar7);
      }
      return;
    }
    if (sStack_30 == 0) {
      uVar5 = std::__cxx11::string::size();
      if (1 < uVar5) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
        bVar2 = isDigitCharacter(*pcVar3);
        if (bVar2) {
          nloc._4_4_ = nloc._4_4_ + 1;
        }
        else if (DVar1 == multiply) {
          puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)unit_string);
          *puVar4 = 0x2a;
        }
        else {
          while( true ) {
            pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
            bVar2 = true;
            if (*pcVar3 != '.') {
              pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
              bVar2 = *pcVar3 == ' ';
            }
            if (!bVar2) break;
            std::__cxx11::string::erase((ulong)unit_string,0);
          }
        }
      }
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
      bVar2 = isDigitCharacter(*pcVar3);
      if (bVar2) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
        bVar2 = isDigitCharacter(*pcVar3);
        if (bVar2) {
          nloc._4_4_ = nloc._4_4_ + 1;
          goto LAB_001b2658;
        }
      }
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
      if (*pcVar3 == '*') {
        nloc._4_4_ = nloc._4_4_ + 1;
      }
      else if (DVar1 == multiply) {
        puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)unit_string);
        *puVar4 = 0x2a;
      }
      else {
        while( true ) {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
          bVar2 = true;
          if (*pcVar3 != '.') {
            pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
            bVar2 = *pcVar3 == ' ';
          }
          if (!bVar2) break;
          std::__cxx11::string::erase((ulong)unit_string,sStack_30);
        }
      }
    }
LAB_001b2658:
    sStack_30 = std::__cxx11::string::find_first_of(cVar7,0x2e);
  } while( true );
}

Assistant:

static void
    cleanDotNotation(std::string& unit_string, std::uint64_t match_flags)
{
    const auto dInt = findDotInterpretation(unit_string);

    // replace all dots with '*'
    size_t st = 0;
    auto dloc = unit_string.find_first_of('.');
    int skipped{0};
    while (dloc != std::string::npos) {
        if (dloc > 0) {
            if (!isDigitCharacter(unit_string[dloc - 1]) ||
                !isDigitCharacter(unit_string[dloc + 1])) {
                if (unit_string[dloc - 1] == '*') {
                    ++skipped;
                } else {
                    if (dInt == DotInterpretation::multiply) {
                        unit_string[dloc] = '*';
                    } else {
                        while (unit_string[dloc] == '.' ||
                               unit_string[dloc] == ' ') {
                            unit_string.erase(dloc, 1);
                        }
                        --dloc;
                    }
                }
            } else {
                ++skipped;
            }
        } else if (unit_string.size() > 1) {
            if (!isDigitCharacter(unit_string[dloc + 1])) {
                if (dInt == DotInterpretation::multiply) {
                    unit_string[dloc] = '*';
                } else {
                    while (unit_string[dloc] == '.' ||
                           unit_string[dloc] == ' ') {
                        unit_string.erase(dloc, 1);
                    }
                    --dloc;
                }
            } else {
                ++skipped;
            }
        }
        st = dloc + 1;
        dloc = unit_string.find_first_of('.', st);
    }

    if (skipped > 1) {
        /* this is needed for some sequential conditions with unusual dot
         * notation that forces some to be a multiply
         */
        skipped = 0;
        dloc = unit_string.find_first_of('.');
        while (dloc != std::string::npos) {
            auto nloc = dloc + 1;
            while (unit_string[nloc] != '.') {
                if (!isDigitCharacter(unit_string[nloc])) {
                    dloc = unit_string.find_first_of('.', nloc + 1);
                    break;
                }
                ++nloc;
            }
            if (unit_string[nloc] == '.') {
                unit_string[nloc] = '*';
                dloc = unit_string.find_first_of('.', nloc + 1);
            } else {
                ++skipped;
            }
        }
    }
    if (skipped >
        0) {  // check for exponents which can't have dots so must be multiply
        dloc = unit_string.find_first_of('.', 2);
        while (dloc != std::string::npos) {
            auto nloc = dloc - 1;
            while (nloc > 0) {
                if (!isDigitCharacter(unit_string[nloc])) {
                    if (unit_string[nloc] == 'e' || unit_string[nloc] == 'E') {
                        unit_string[dloc] = '*';
                    }
                    break;
                }
                --nloc;
            }
            dloc = unit_string.find_first_of('.', dloc + 1);
        }
    }
    if ((match_flags & single_slash) != 0) {
        auto slashloc = unit_string.find_last_of('/');
        if (slashloc != std::string::npos) {
            unit_string.insert(slashloc + 1, 1, '(');
            unit_string.push_back(')');
        }
    }
}